

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::cpp_function::cpp_function<std::__cxx11::string,Person>
          (cpp_function *this,offset_in_Job_to_subr f)

{
  type local_20;
  
  (this->super_function).super_object.super_handle.m_ptr = (PyObject *)0x0;
  local_20.f = f;
  initialize<pybind11::cpp_function::initialize<std::__cxx11::string,Person>(std::__cxx11::string(Person::*)()const)::_lambda(Person_const*)_1_,std::__cxx11::string,Person_const*>
            (this,&local_20,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Person_ptr *)
             0x0);
  return;
}

Assistant:

cpp_function(Return (Class::*f)(Arg...) const PYBIND11_NOEXCEPT_SPECIFIER, const Extra&... extra) {
        initialize([f](const Class *c, Arg... args) -> Return { return (c->*f)(args...); },
                   (Return (*)(const Class *, Arg ...) PYBIND11_NOEXCEPT_SPECIFIER) nullptr, extra...);
    }